

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre.cc
# Opt level: O0

char * re2::TerminateNumber(char *buf,char *str,int n)

{
  int iVar1;
  int n_local;
  char *str_local;
  char *buf_local;
  
  if ((n < 1) || (iVar1 = isspace((int)*str), iVar1 == 0)) {
    iVar1 = isdigit((int)str[n]);
    if (((iVar1 != 0) || (('`' < str[n] && (str[n] < 'g')))) ||
       ((buf_local = str, '@' < str[n] && (str[n] < 'G')))) {
      if (n < 0x21) {
        memcpy(buf,str,(long)n);
        buf[n] = '\0';
        buf_local = buf;
      }
      else {
        buf_local = "";
      }
    }
  }
  else {
    buf_local = "";
  }
  return buf_local;
}

Assistant:

static const char* TerminateNumber(char* buf, const char* str, int n) {
  if ((n > 0) && isspace(*str)) {
    // We are less forgiving than the strtoxxx() routines and do not
    // allow leading spaces.
    return "";
  }

  // See if the character right after the input text may potentially
  // look like a digit.
  if (isdigit(str[n]) ||
      ((str[n] >= 'a') && (str[n] <= 'f')) ||
      ((str[n] >= 'A') && (str[n] <= 'F'))) {
    if (n > kMaxNumberLength) return ""; // Input too big to be a valid number
    memcpy(buf, str, n);
    buf[n] = '\0';
    return buf;
  } else {
    // We can parse right out of the supplied string, so return it.
    return str;
  }
}